

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

double __thiscall embree::BVHNStatistics<4>::Statistics::fillRate(Statistics *this,BVH *bvh)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar2 = (this->statAABBNodes).numChildren;
  uVar3 = (this->statOBBNodes).numChildren;
  uVar4 = (this->statAABBNodesMB).numChildren;
  uVar5 = (this->statAABBNodesMB4D).numChildren;
  uVar6 = (this->statOBBNodesMB).numChildren;
  uVar14 = (this->statAABBNodes).numNodes << 2;
  uVar13 = (this->statOBBNodes).numNodes << 2;
  uVar12 = (this->statAABBNodesMB).numNodes << 2;
  uVar11 = (this->statAABBNodesMB4D).numNodes << 2;
  uVar10 = (this->statOBBNodesMB).numNodes << 2;
  uVar9 = (this->statQuantizedNodes).numNodes << 2;
  uVar7 = (this->statLeaf).numPrimsActive;
  uVar8 = (this->statLeaf).numPrimsTotal;
  uVar1 = (this->statQuantizedNodes).numChildren;
  return (((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          (double)(uVar1 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar6 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar5 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar4 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar3 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar2 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar7 & 0xffffffff | 0x4330000000000000)) /
         (((double)(uVar9 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
          (double)(uVar9 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar10 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar10 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar11 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar12 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar12 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar13 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar13 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar14 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar14 & 0xffffffff | 0x4330000000000000) +
         ((double)(uVar8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar8 & 0xffffffff | 0x4330000000000000));
}

Assistant:

double fillRateNom () const { return double(numChildren);  }